

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O1

void __thiscall KDReports::Report::setHeaderLocation(Report *this,HeaderLocations hl,Header *header)

{
  ReportPrivate *pRVar1;
  HeaderMap *this_00;
  HeaderLocations loc;
  Int local_30;
  key_type local_2c;
  Header *local_28;
  
  this_00 = &((this->d)._M_t.
              super___uniq_ptr_impl<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
              ._M_t.
              super__Tuple_impl<0UL,_KDReports::ReportPrivate_*,_std::default_delete<KDReports::ReportPrivate>_>
              .super__Head_base<0UL,_KDReports::ReportPrivate_*,_false>._M_head_impl)->m_headers;
  local_2c.i = hl.i;
  local_28 = header;
  local_30 = (Int)HeaderMap::headerLocation(this_00,header);
  QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::remove
            (&this_00->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>,
             (char *)&local_30);
  pRVar1 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::ReportPrivate_*,_std::default_delete<KDReports::ReportPrivate>_>
           .super__Head_base<0UL,_KDReports::ReportPrivate_*,_false>._M_head_impl;
  QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::detach
            (&(pRVar1->m_headers).super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>
            );
  std::
  map<QFlags<KDReports::HeaderLocation>,KDReports::Header*,std::less<QFlags<KDReports::HeaderLocation>>,std::allocator<std::pair<QFlags<KDReports::HeaderLocation>const,KDReports::Header*>>>
  ::insert_or_assign<KDReports::Header*const&>
            ((map<QFlags<KDReports::HeaderLocation>,KDReports::Header*,std::less<QFlags<KDReports::HeaderLocation>>,std::allocator<std::pair<QFlags<KDReports::HeaderLocation>const,KDReports::Header*>>>
              *)((long)(pRVar1->m_headers).
                       super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>.d + 8),
             &local_2c,&local_28);
  return;
}

Assistant:

void KDReports::Report::setHeaderLocation(HeaderLocations hl, Header *header)
{
    // Remove old entry for this header
    HeaderLocations loc = d->m_headers.headerLocation(header);
    d->m_headers.remove(loc);
    d->m_headers.insert(hl, header);
}